

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sounds.cpp
# Opt level: O3

bool __thiscall CSounds::IsPlaying(CSounds *this,int SetId)

{
  CDataSoundset *pCVar1;
  ISound *pIVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  
  if (((-1 < SetId) && (this->m_WaitForSoundJob == false)) && (SetId < g_pData->m_NumSounds)) {
    pCVar1 = g_pData->m_aSounds;
    if (0 < pCVar1[(uint)SetId].m_NumSounds) {
      lVar5 = 0;
      lVar4 = 0;
      do {
        pIVar2 = ((this->super_CComponent).m_pClient)->m_pSound;
        iVar3 = (*(pIVar2->super_IInterface)._vptr_IInterface[0xb])
                          (pIVar2,(ulong)*(uint *)((long)&((pCVar1[(uint)SetId].m_aSounds)->m_Id).
                                                          m_Id + lVar5));
        if ((char)iVar3 != '\0') {
          return (bool)(char)iVar3;
        }
        lVar4 = lVar4 + 1;
        lVar5 = lVar5 + 0x10;
      } while (lVar4 < pCVar1[(uint)SetId].m_NumSounds);
      return false;
    }
  }
  return false;
}

Assistant:

bool CSounds::IsPlaying(int SetId)
{
	if(m_WaitForSoundJob || SetId < 0 || SetId >= g_pData->m_NumSounds)
		return false;

	CDataSoundset *pSet = &g_pData->m_aSounds[SetId];
	for(int i = 0; i < pSet->m_NumSounds; i++)
	{
		if(Sound()->IsPlaying(pSet->m_aSounds[i].m_Id))
			return true;
	}
	return false;
}